

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawListSharedData::SetCircleTessellationMaxError(ImDrawListSharedData *this,float max_error)

{
  ImU8 IVar1;
  uint uVar2;
  int i;
  long lVar3;
  float fVar4;
  float fVar5;
  
  if ((this->CircleSegmentMaxError != max_error) ||
     (NAN(this->CircleSegmentMaxError) || NAN(max_error))) {
    if (max_error <= 0.0) {
      __assert_fail("max_error > 0.0f",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                    ,0x18d,"void ImDrawListSharedData::SetCircleTessellationMaxError(float)");
    }
    this->CircleSegmentMaxError = max_error;
    lVar3 = 0;
    do {
      if (lVar3 == 0) {
        IVar1 = '\0';
      }
      else {
        fVar4 = (float)(int)lVar3;
        fVar5 = this->CircleSegmentMaxError;
        if (fVar4 <= this->CircleSegmentMaxError) {
          fVar5 = fVar4;
        }
        fVar5 = acosf(1.0 - fVar5 / fVar4);
        fVar5 = ceilf(3.1415927 / fVar5);
        uVar2 = ((int)fVar5 - ((int)fVar5 + 1 >> 0x1f)) + 1U & 0xfffffffe;
        if (0x1ff < (int)uVar2) {
          uVar2 = 0x200;
        }
        IVar1 = (ImU8)uVar2;
        if ((int)uVar2 < 5) {
          IVar1 = '\x04';
        }
      }
      this->CircleSegmentCounts[lVar3] = IVar1;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
    this->ArcFastRadiusCutoff = this->CircleSegmentMaxError / 0.0021410584;
  }
  return;
}

Assistant:

void ImDrawListSharedData::SetCircleTessellationMaxError(float max_error)
{
    if (CircleSegmentMaxError == max_error)
        return;

    IM_ASSERT(max_error > 0.0f);
    CircleSegmentMaxError = max_error;
    for (int i = 0; i < IM_ARRAYSIZE(CircleSegmentCounts); i++)
    {
        const float radius = (float)i;
        CircleSegmentCounts[i] = (ImU8)((i > 0) ? IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_CALC(radius, CircleSegmentMaxError) : 0);
    }
    ArcFastRadiusCutoff = IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_CALC_R(IM_DRAWLIST_ARCFAST_SAMPLE_MAX, CircleSegmentMaxError);
}